

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_avx2.c
# Opt level: O2

void highbd_calc8x8var_avx2
               (uint16_t *src,int src_stride,uint16_t *ref,int ref_stride,uint32_t *sse,int *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  for (uVar3 = 0; auVar4 = auVar5._0_32_, uVar3 < 8; uVar3 = uVar3 + 2) {
    auVar7._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)src_stride * 2) +
         ZEXT116(1) * *(undefined1 (*) [16])src;
    auVar7._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])src + (long)src_stride * 2);
    auVar8._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + (long)ref_stride * 2) +
         ZEXT116(1) * *(undefined1 (*) [16])ref;
    auVar8._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) * *(undefined1 (*) [16])(*(undefined1 (*) [16])ref + (long)ref_stride * 2);
    auVar7 = vpsubw_avx2(auVar7,auVar8);
    auVar8 = vpmaddwd_avx2(auVar7,auVar7);
    auVar7 = vpaddw_avx2(auVar7,auVar6._0_32_);
    auVar6 = ZEXT3264(auVar7);
    auVar4 = vpaddd_avx2(auVar8,auVar4);
    auVar5 = ZEXT3264(auVar4);
    ref = (uint16_t *)(*(undefined1 (*) [16])ref + (long)(ref_stride * 2) * 2);
    src = (uint16_t *)(*(undefined1 (*) [16])src + (long)(src_stride * 2) * 2);
  }
  auVar7 = vpmovsxwd_avx2(auVar6._0_16_);
  auVar8 = vpmovsxwd_avx2(auVar6._16_16_);
  auVar7 = vpaddd_avx2(auVar7,auVar8);
  auVar8 = vpunpckldq_avx2(auVar7,auVar4);
  auVar4 = vpunpckhdq_avx2(auVar7,auVar4);
  auVar4 = vpaddd_avx2(auVar8,auVar4);
  auVar1 = vpaddd_avx(auVar4._0_16_,auVar4._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddd_avx(auVar1,auVar2);
  *sum = auVar1._0_4_;
  *sse = auVar1._4_4_;
  return;
}

Assistant:

static void highbd_calc8x8var_avx2(const uint16_t *src, int src_stride,
                                   const uint16_t *ref, int ref_stride,
                                   uint32_t *sse, int *sum) {
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();
  for (int i = 0; i < 8; i += 2) {
    const __m128i v_p_a0 = _mm_loadu_si128((const __m128i *)src);
    const __m128i v_p_a1 = _mm_loadu_si128((const __m128i *)(src + src_stride));
    const __m128i v_p_b0 = _mm_loadu_si128((const __m128i *)ref);
    const __m128i v_p_b1 = _mm_loadu_si128((const __m128i *)(ref + ref_stride));
    __m256i v_p_a = _mm256_castsi128_si256(v_p_a0);
    __m256i v_p_b = _mm256_castsi128_si256(v_p_b0);
    v_p_a = _mm256_inserti128_si256(v_p_a, v_p_a1, 1);
    v_p_b = _mm256_inserti128_si256(v_p_b, v_p_b1, 1);
    const __m256i v_diff = _mm256_sub_epi16(v_p_a, v_p_b);
    const __m256i v_sqrdiff = _mm256_madd_epi16(v_diff, v_diff);
    v_sum_d = _mm256_add_epi16(v_sum_d, v_diff);
    v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff);
    src += src_stride * 2;
    ref += ref_stride * 2;
  }
  __m256i v_sum00 = _mm256_cvtepi16_epi32(_mm256_castsi256_si128(v_sum_d));
  __m256i v_sum01 = _mm256_cvtepi16_epi32(_mm256_extracti128_si256(v_sum_d, 1));
  __m256i v_sum0 = _mm256_add_epi32(v_sum00, v_sum01);
  __m256i v_d_l = _mm256_unpacklo_epi32(v_sum0, v_sse_d);
  __m256i v_d_h = _mm256_unpackhi_epi32(v_sum0, v_sse_d);
  __m256i v_d_lh = _mm256_add_epi32(v_d_l, v_d_h);
  const __m128i v_d0_d = _mm256_castsi256_si128(v_d_lh);
  const __m128i v_d1_d = _mm256_extracti128_si256(v_d_lh, 1);
  __m128i v_d = _mm_add_epi32(v_d0_d, v_d1_d);
  v_d = _mm_add_epi32(v_d, _mm_srli_si128(v_d, 8));
  *sum = _mm_extract_epi32(v_d, 0);
  *sse = _mm_extract_epi32(v_d, 1);
}